

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_ameth.c
# Opt level: O0

int rsa_sig_info_set(X509_SIG_INFO *siginf,X509_ALGOR *sigalg,ASN1_STRING *sig)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RSA_PSS_PARAMS *a;
  undefined8 *in_RSI;
  X509_SIG_INFO *in_RDI;
  int secbits;
  RSA_PSS_PARAMS *pss;
  EVP_MD *md;
  EVP_MD *mgf1md;
  uint32_t flags;
  int saltlen;
  int mdnid;
  int rv;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  EVP_MD *md_00;
  uint32_t local_30;
  int local_2c;
  int local_24;
  int local_4;
  
  local_24 = 0;
  md_00 = (EVP_MD *)0x0;
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)*in_RSI);
  if (iVar1 == 0x390) {
    a = ossl_rsa_pss_decode((X509_ALGOR *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar1 = ossl_rsa_pss_get_param
                      ((RSA_PSS_PARAMS *)md_00,(EVP_MD **)a,
                       (EVP_MD **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar1 != 0) {
      iVar1 = EVP_MD_get_type(md_00);
      if ((((iVar1 == 0x2a0) || (iVar1 == 0x2a1)) || (iVar1 == 0x2a2)) &&
         ((iVar3 = iVar1, iVar2 = EVP_MD_get_type((EVP_MD *)0x0), iVar3 == iVar2 &&
          (iVar3 = EVP_MD_get_size((EVP_MD *)CONCAT44(local_2c,in_stack_ffffffffffffffa8)),
          in_stack_ffffffffffffffac = local_2c, local_2c == iVar3)))) {
        local_30 = 2;
      }
      else {
        local_30 = 0;
        local_2c = in_stack_ffffffffffffffac;
      }
      iVar3 = EVP_MD_get_size((EVP_MD *)CONCAT44(local_2c,in_stack_ffffffffffffffa8));
      iVar3 = iVar3 << 2;
      if (iVar1 == 0x40) {
        iVar3 = 0x40;
      }
      else if (iVar1 == 0x72) {
        iVar3 = 0x44;
      }
      else if (iVar1 == 4) {
        iVar3 = 0x27;
      }
      X509_SIG_INFO_set(in_RDI,iVar1,0x390,iVar3,local_30);
      local_24 = 1;
    }
    RSA_PSS_PARAMS_free((RSA_PSS_PARAMS *)a);
    local_4 = local_24;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int rsa_sig_info_set(X509_SIG_INFO *siginf, const X509_ALGOR *sigalg,
                            const ASN1_STRING *sig)
{
    int rv = 0;
    int mdnid, saltlen;
    uint32_t flags;
    const EVP_MD *mgf1md = NULL, *md = NULL;
    RSA_PSS_PARAMS *pss;
    int secbits;

    /* Sanity check: make sure it is PSS */
    if (OBJ_obj2nid(sigalg->algorithm) != EVP_PKEY_RSA_PSS)
        return 0;
    /* Decode PSS parameters */
    pss = ossl_rsa_pss_decode(sigalg);
    if (!ossl_rsa_pss_get_param(pss, &md, &mgf1md, &saltlen))
        goto err;
    mdnid = EVP_MD_get_type(md);
    /*
     * For TLS need SHA256, SHA384 or SHA512, digest and MGF1 digest must
     * match and salt length must equal digest size
     */
    if ((mdnid == NID_sha256 || mdnid == NID_sha384 || mdnid == NID_sha512)
            && mdnid == EVP_MD_get_type(mgf1md)
            && saltlen == EVP_MD_get_size(md))
        flags = X509_SIG_INFO_TLS;
    else
        flags = 0;
    /* Note: security bits half number of digest bits */
    secbits = EVP_MD_get_size(md) * 4;
    /*
     * SHA1 and MD5 are known to be broken. Reduce security bits so that
     * they're no longer accepted at security level 1. The real values don't
     * really matter as long as they're lower than 80, which is our security
     * level 1.
     * https://eprint.iacr.org/2020/014 puts a chosen-prefix attack for SHA1 at
     * 2^63.4
     * https://documents.epfl.ch/users/l/le/lenstra/public/papers/lat.pdf
     * puts a chosen-prefix attack for MD5 at 2^39.
     */
    if (mdnid == NID_sha1)
        secbits = 64;
    else if (mdnid == NID_md5_sha1)
        secbits = 68;
    else if (mdnid == NID_md5)
        secbits = 39;
    X509_SIG_INFO_set(siginf, mdnid, EVP_PKEY_RSA_PSS, secbits,
                      flags);
    rv = 1;
    err:
    RSA_PSS_PARAMS_free(pss);
    return rv;
}